

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O3

Entry * __thiscall
Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::grow
          (PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*> *this,
          Entry *oldEntries,size_t *newMemUsed)

{
  pointer *pppEVar1;
  iterator __position;
  uint uVar2;
  ulong *puVar3;
  size_t sVar4;
  ulong uVar5;
  Entry *pEVar6;
  ulong uVar7;
  Entry *pEVar8;
  uint32_t uVar9;
  size_t sVar10;
  Entry *local_28;
  
  __position._M_current =
       (this->_oldEntries).
       super__Vector_base<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::Entry_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_28 = oldEntries;
  if (__position._M_current ==
      (this->_oldEntries).
      super__Vector_base<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::Entry_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,Ptex::v2_2::PtexCachedReader*>::Entry*,std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,Ptex::v2_2::PtexCachedReader*>::Entry*>>
    ::
    _M_realloc_insert<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,Ptex::v2_2::PtexCachedReader*>::Entry*const&>
              ((vector<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,Ptex::v2_2::PtexCachedReader*>::Entry*,std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,Ptex::v2_2::PtexCachedReader*>::Entry*>>
                *)&this->_oldEntries,__position,&local_28);
  }
  else {
    *__position._M_current = oldEntries;
    pppEVar1 = &(this->_oldEntries).
                super__Vector_base<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::Entry_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppEVar1 = *pppEVar1 + 1;
  }
  uVar2 = this->_numEntries * 2;
  sVar10 = (ulong)uVar2 * 0x20;
  puVar3 = (ulong *)operator_new__(sVar10 + 8);
  *puVar3 = (ulong)uVar2;
  if (uVar2 != 0) {
    sVar4 = 0;
    do {
      *(undefined8 *)((long)puVar3 + sVar4 + 8) = 0;
      *(undefined4 *)((long)puVar3 + sVar4 + 0x10) = 0;
      *(undefined4 *)((long)puVar3 + sVar4 + 0x14) = 0;
      *(undefined1 *)((long)puVar3 + sVar4 + 0x18) = 0;
      *(undefined8 *)((long)puVar3 + sVar4 + 0x20) = 0;
      sVar4 = sVar4 + 0x20;
    } while (sVar10 != sVar4);
  }
  *newMemUsed = sVar10;
  if (this->_numEntries != 0) {
    uVar5 = 0;
    do {
      if (local_28[uVar5].value != (PtexCachedReader *)0x0) {
        pEVar6 = local_28 + uVar5;
        uVar9 = (pEVar6->key)._hash;
        do {
          uVar7 = (ulong)(uVar9 & uVar2 - 1);
          uVar9 = uVar9 + 1;
        } while (puVar3[uVar7 * 4 + 4] != 0);
        pEVar8 = (Entry *)(puVar3 + 1) + uVar7;
        (pEVar8->key)._val = (pEVar6->key)._val;
        (pEVar8->key)._len = (pEVar6->key)._len;
        (pEVar8->key)._hash = (pEVar6->key)._hash;
        (pEVar8->key)._ownsVal = (pEVar6->key)._ownsVal;
        (pEVar6->key)._ownsVal = false;
        pEVar8->value = pEVar6->value;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->_numEntries);
  }
  this->_numEntries = uVar2;
  return (Entry *)(puVar3 + 1);
}

Assistant:

Entry* grow(Entry* oldEntries, size_t& newMemUsed)
    {
        _oldEntries.push_back(oldEntries);
        uint32_t numNewEntries = _numEntries*2;
        Entry* entries = new Entry[numNewEntries];
        newMemUsed = numNewEntries * sizeof(Entry);
        uint32_t mask = numNewEntries-1;
        for (uint32_t oldIndex = 0; oldIndex < _numEntries; ++oldIndex) {
            Entry& oldEntry = oldEntries[oldIndex];
            if (oldEntry.value) {
                for (int newIndex = oldEntry.key.hash();; ++newIndex) {
                    Entry& newEntry = entries[newIndex&mask];
                    if (!newEntry.value) {
                        newEntry.key.move(oldEntry.key);
                        newEntry.value = oldEntry.value;
                        break;
                    }
                }
            }
        }
        _numEntries = numNewEntries;
        return entries;
    }